

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

void __thiscall
clipp::detail::scoped_dfs_traverser::return_to_outermost_scope(scoped_dfs_traverser *this)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  _Elt_pointer pmVar4;
  
  pcVar1 = (this->posAfterLastMatch_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->posAfterLastMatch_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish != pcVar1) {
    (this->posAfterLastMatch_).stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar1;
  }
  if ((this->scopes_).c.
      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->scopes_).c.
      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pcVar1 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pos_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish != pcVar1) {
      (this->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar1;
    }
    this->repeatGroupContinues_ = false;
  }
  else {
    pmVar4 = (this->scopes_).c.
             super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pmVar4 != (this->scopes_).c.
                  super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        pcVar1 = (this->pos_).stack_.
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = (this->pos_).stack_.
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((pcVar1 != pcVar2) &&
           ((int)((ulong)((long)pcVar2 - (long)pcVar1) >> 3) * -0x55555555 < 1)) break;
        if (pmVar4 == (this->scopes_).c.
                      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pmVar4 = (this->scopes_).c.
                   super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        group::depth_first_traverser::undo(&this->pos_,pmVar4 + -1);
        std::
        deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
        ::pop_back(&(this->scopes_).c);
        pmVar4 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      } while (pmVar4 != (this->scopes_).c.
                         super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    while ((this->scopes_).c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           (this->scopes_).c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::
      deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ::pop_back(&(this->scopes_).c);
    }
    bVar3 = repeat_group_continues(this);
    this->repeatGroupContinues_ = bVar3;
  }
  return;
}

Assistant:

void return_to_outermost_scope()
    {
        posAfterLastMatch_.invalidate();

        if(scopes_.empty()) {
            pos_.invalidate();
            repeatGroupContinues_ = false;
            return;
        }

        while(!scopes_.empty() && (!pos_ || pos_.level() >= 1)) {
            pos_.undo(scopes_.top());
            scopes_.pop();
        }
        while(!scopes_.empty()) scopes_.pop();

        repeatGroupContinues_ = repeat_group_continues();
    }